

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzterm.c
# Opt level: O0

wchar_t main(wchar_t argc,char **argv)

{
  _Bool utf8_override;
  wchar_t vtmode;
  int iVar1;
  Conf *conf_00;
  char *linecharset;
  Terminal *term_00;
  size_t len_00;
  TermWin local_1748;
  TermWin termwin;
  unicode_data ucsdata;
  Conf *conf;
  Terminal *term;
  size_t len;
  char blk [512];
  char **argv_local;
  wchar_t argc_local;
  
  local_1748.vt = &fuzz_termwin_vt;
  blk._504_8_ = argv;
  conf_00 = conf_new();
  do_defaults((char *)0x0,conf_00);
  linecharset = conf_get_str(conf_00,0xa6);
  utf8_override = conf_get_bool(conf_00,0xa8);
  vtmode = conf_get_int(conf_00,0xa5);
  init_ucs((unicode_data *)((long)&termwin.vt + 4),linecharset,utf8_override,L'\0',vtmode);
  term_00 = term_init(conf_00,(unicode_data *)((long)&termwin.vt + 4),&local_1748);
  term_size(term_00,L'\x18',L'P',L'✐');
  term_00->ldisc = (Ldisc *)0x0;
  while( true ) {
    iVar1 = feof(_stdin);
    if (iVar1 != 0) break;
    len_00 = fread(&len,1,0x200,_stdin);
    term_data(term_00,&len,len_00);
  }
  term_update(term_00);
  return L'\0';
}

Assistant:

int main(int argc, char **argv)
{
        char blk[512];
        size_t len;
        Terminal *term;
        Conf *conf;
        struct unicode_data ucsdata;
        TermWin termwin;

        termwin.vt = &fuzz_termwin_vt;

        conf = conf_new();
        do_defaults(NULL, conf);
        init_ucs(&ucsdata, conf_get_str(conf, CONF_line_codepage),
                 conf_get_bool(conf, CONF_utf8_override),
                 CS_NONE, conf_get_int(conf, CONF_vtmode));

        term = term_init(conf, &ucsdata, &termwin);
        term_size(term, 24, 80, 10000);
        term->ldisc = NULL;
        /* Tell american fuzzy lop that this is a good place to fork. */
#ifdef __AFL_HAVE_MANUAL_CONTROL
        __AFL_INIT();
#endif
        while (!feof(stdin)) {
                len = fread(blk, 1, sizeof(blk), stdin);
                term_data(term, blk, len);
        }
        term_update(term);
        return 0;
}